

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestExtensionOrderings2_TestExtensionOrderings3::ByteSizeLong
          (TestExtensionOrderings2_TestExtensionOrderings3 *this)

{
  uint32_t *puVar1;
  string *value;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestExtensionOrderings2_TestExtensionOrderings3 *this_;
  TestExtensionOrderings2_TestExtensionOrderings3 *this_local;
  
  sStack_20 = 0;
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 1) != 0) {
    value = _internal_my_string_abi_cxx11_(this);
    sStack_20 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sStack_20 = sStack_20 + 1;
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestExtensionOrderings2_TestExtensionOrderings3::ByteSizeLong() const {
  const TestExtensionOrderings2_TestExtensionOrderings3& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestExtensionOrderings2.TestExtensionOrderings3)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // string my_string = 1;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_my_string());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}